

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::requiresAdvancedBlendEq
               (BlendState *pre,BlendState *post,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers)

{
  bool bVar1;
  size_type sVar2;
  const_reference this;
  BlendState *pBVar3;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar4;
  uint *puVar5;
  BlendState *drawBufferBlendState;
  int drawBufferNdx;
  bool requiresAdvancedBlendEq;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *drawBuffers_local;
  BlendState *post_local;
  BlendState *pre_local;
  
  drawBufferBlendState._7_1_ = false;
  bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&pre->blendEq);
  if (bVar1) {
    pEVar4 = tcu::
             Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
             ::operator->(&pre->blendEq);
    bVar1 = tcu::
            Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
            is<unsigned_int>(pEVar4);
    if (bVar1) {
      pEVar4 = tcu::
               Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
               ::operator->(&pre->blendEq);
      puVar5 = tcu::
               Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
               ::get<unsigned_int>(pEVar4);
      drawBufferBlendState._7_1_ = isAdvancedBlendEq(*puVar5);
    }
  }
  bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&post->blendEq);
  if (bVar1) {
    pEVar4 = tcu::
             Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
             ::operator->(&post->blendEq);
    bVar1 = tcu::
            Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
            is<unsigned_int>(pEVar4);
    if (bVar1) {
      pEVar4 = tcu::
               Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
               ::operator->(&post->blendEq);
      puVar5 = tcu::
               Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
               ::get<unsigned_int>(pEVar4);
      bVar1 = isAdvancedBlendEq(*puVar5);
      drawBufferBlendState._7_1_ = drawBufferBlendState._7_1_ != false || bVar1;
    }
  }
  for (drawBufferBlendState._0_4_ = 0;
      sVar2 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              ::size(drawBuffers), (int)drawBufferBlendState < (int)sVar2;
      drawBufferBlendState._0_4_ = (int)drawBufferBlendState + 1) {
    this = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
           ::operator[](drawBuffers,(long)(int)drawBufferBlendState);
    pBVar3 = DrawBufferInfo::getBlendState(this);
    bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&pBVar3->blendEq);
    if (bVar1) {
      pEVar4 = tcu::
               Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
               ::operator->(&pBVar3->blendEq);
      bVar1 = tcu::
              Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
              ::is<unsigned_int>(pEVar4);
      if (bVar1) {
        pEVar4 = tcu::
                 Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
                 ::operator->(&pBVar3->blendEq);
        puVar5 = tcu::
                 Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 ::get<unsigned_int>(pEVar4);
        bVar1 = isAdvancedBlendEq(*puVar5);
        drawBufferBlendState._7_1_ = drawBufferBlendState._7_1_ != false || bVar1;
      }
    }
  }
  return drawBufferBlendState._7_1_;
}

Assistant:

bool requiresAdvancedBlendEq (const BlendState& pre, const BlendState post, const vector<DrawBufferInfo>& drawBuffers)
{
	bool requiresAdvancedBlendEq = false;

	if (pre.blendEq && pre.blendEq->is<BlendEq>())
		requiresAdvancedBlendEq |= isAdvancedBlendEq(pre.blendEq->get<BlendEq>());

	if (post.blendEq && post.blendEq->is<BlendEq>())
		requiresAdvancedBlendEq |= isAdvancedBlendEq(post.blendEq->get<BlendEq>());

	for (int drawBufferNdx = 0; drawBufferNdx < (int)drawBuffers.size(); drawBufferNdx++)
	{
		const BlendState& drawBufferBlendState = drawBuffers[drawBufferNdx].getBlendState();

		if (drawBufferBlendState.blendEq && drawBufferBlendState.blendEq->is<BlendEq>())
			requiresAdvancedBlendEq |= isAdvancedBlendEq(drawBufferBlendState.blendEq->get<BlendEq>());
	}

	return requiresAdvancedBlendEq;
}